

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O0

void GetORGinfo(int *Wait,uchar *Track,unsigned_short *Freq,long *CurrentMeasure,long *TotalMeasure,
               int *Crotchet,int *Bar,int *StartingLoop)

{
  int iVar1;
  uint uVar2;
  int local_44;
  int a;
  int OrgPos;
  int StepsPerMeasure;
  int *Crotchet_local;
  long *TotalMeasure_local;
  long *CurrentMeasure_local;
  unsigned_short *Freq_local;
  uchar *Track_local;
  int *Wait_local;
  
  *Wait = (uint)org_data.info.wait;
  *Crotchet = (uint)org_data.info.dot;
  *Bar = (uint)org_data.info.line;
  iVar1 = (uint)org_data.info.line * (uint)org_data.info.dot;
  *StartingLoop = (int)(org_data.info.repeat_x / (long)iVar1);
  *TotalMeasure = org_data.info.end_x / (long)iVar1 + -1;
  uVar2 = GetOrganyaPosition();
  *CurrentMeasure = (long)((int)(uVar2 - (int)uVar2 % iVar1) / iVar1);
  for (local_44 = 0; local_44 < 8; local_44 = local_44 + 1) {
    Track[local_44] = org_data.info.tdata[local_44].wave_no;
    Freq[local_44] = org_data.info.tdata[local_44].freq;
  }
  return;
}

Assistant:

void GetORGinfo(int*Wait, unsigned char Track[8], unsigned short Freq[8], long*CurrentMeasure, long*TotalMeasure, int*Crotchet, int*Bar, int*StartingLoop) {
	//get wait time, measure total, total steps, tracks, and freqencies
	*Wait = org_data.info.wait;
	*Crotchet = org_data.info.dot;
	*Bar = org_data.info.line;

	int StepsPerMeasure = org_data.info.line * org_data.info.dot;
	*StartingLoop = org_data.info.repeat_x / StepsPerMeasure;
	*TotalMeasure = org_data.info.end_x / StepsPerMeasure -1; //subtract 1 because last measure is never played

	int OrgPos = GetOrganyaPosition();
	*CurrentMeasure = (OrgPos -= (OrgPos % StepsPerMeasure))/StepsPerMeasure;


	//loop for track stuff
	for (int a = 0; a < 8; a++) {
		Track[a] = org_data.info.tdata[a].wave_no;
		Freq[a] = org_data.info.tdata[a].freq;
	}
}